

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socketpair.c
# Opt level: O0

int Curl_socketpair(int domain,int type,int protocol,curl_socket_t *socks,_Bool nonblocking)

{
  int iVar1;
  uint local_28;
  _Bool nonblocking_local;
  curl_socket_t *socks_local;
  int protocol_local;
  int type_local;
  int domain_local;
  
  local_28 = type;
  if (nonblocking) {
    local_28 = type | 0x800;
  }
  iVar1 = socketpair(domain,local_28,protocol,socks);
  if (iVar1 == 0) {
    type_local = 0;
  }
  else {
    type_local = -1;
  }
  return type_local;
}

Assistant:

int Curl_socketpair(int domain, int type, int protocol,
                    curl_socket_t socks[2], bool nonblocking)
{
#ifdef SOCK_NONBLOCK
  type = nonblocking ? type | SOCK_NONBLOCK : type;
#endif
  if(socketpair(domain, type, protocol, socks))
    return -1;
#ifndef SOCK_NONBLOCK
  if(nonblocking) {
    if(curlx_nonblock(socks[0], TRUE) < 0 ||
       curlx_nonblock(socks[1], TRUE) < 0) {
      close(socks[0]);
      close(socks[1]);
      return -1;
    }
  }
#endif
  return 0;
}